

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

wasm_externkind_t FromWabtExternKind(ExternKind kind)

{
  wasm_externkind_t wVar1;
  
  switch(kind) {
  case First:
    wVar1 = '\0';
    break;
  case Table:
    wVar1 = '\x02';
    break;
  case Memory:
    wVar1 = '\x03';
    break;
  case Global:
    wVar1 = '\x01';
    break;
  default:
    abort();
  }
  return wVar1;
}

Assistant:

static wasm_externkind_t FromWabtExternKind(ExternKind kind) {
  switch (kind) {
    case ExternalKind::Func:
      return WASM_EXTERN_FUNC;
    case ExternalKind::Global:
      return WASM_EXTERN_GLOBAL;
    case ExternalKind::Table:
      return WASM_EXTERN_TABLE;
    case ExternalKind::Memory:
      return WASM_EXTERN_MEMORY;
    case ExternalKind::Tag:
      WABT_UNREACHABLE;
  }
  WABT_UNREACHABLE;
}